

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

ProgramBinary * __thiscall
vk::BinaryRegistryDetail::BinaryRegistryReader::loadProgram
          (BinaryRegistryReader *this,ProgramIdentifier *id)

{
  Archive *pAVar1;
  PtrData<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
  data;
  int iVar2;
  uint uVar3;
  LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *pLVar4;
  undefined4 extraout_var;
  BinaryIndexNode *pBVar5;
  undefined4 extraout_var_00;
  ProgramBinary *this_00;
  InternalError *pIVar6;
  ProgramNotFoundException *this_01;
  ulong uVar7;
  ulong uVar8;
  size_t ndx;
  deUint32 *pdVar9;
  undefined8 uStack_a8;
  string fullPath;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> progRes;
  UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> local_40;
  
  pLVar4 = (this->m_binaryIndex).
           super_UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
           .m_data.ptr;
  if (pLVar4 == (LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *)0x0) {
    pLVar4 = (LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode> *)operator_new(0x50);
    pAVar1 = this->m_archive;
    anon_unknown_8::getIndexPath(&fullPath,&this->m_srcPath);
    iVar2 = (*pAVar1->_vptr_Archive[2])(pAVar1,fullPath._M_dataplus._M_p);
    local_40.m_data.ptr = (Resource *)CONCAT44(extraout_var,iVar2);
    LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>::LazyResource
              (pLVar4,(MovePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)&local_40);
    bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    data._8_8_ = fullPath._M_dataplus._M_p;
    data.ptr = uStack_a8;
    de::details::
    UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
    ::assignData(&(this->m_binaryIndex).
                  super_UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
                 ,data);
    de::details::
    UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
    ::~UniqueBase((UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
                   *)&bytes);
    de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::~UniqueBase
              (&local_40);
    std::__cxx11::string::~string((string *)&fullPath);
    pLVar4 = (this->m_binaryIndex).
             super_UniqueBase<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>,_de::DefaultDeleter<vk::BinaryRegistryDetail::LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>_>_>
             .m_data.ptr;
  }
  anon_unknown_8::getSearchPath((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&fullPath,id)
  ;
  ndx = 0;
  uVar8 = 0;
  do {
    while( true ) {
      pBVar5 = LazyResource<vk::BinaryRegistryDetail::BinaryIndexNode>::operator[](pLVar4,ndx);
      if (pBVar5->word != *(deUint32 *)(fullPath._M_dataplus._M_p + uVar8 * 4)) break;
      uVar8 = uVar8 + 1;
      uVar7 = (long)(fullPath._M_string_length - (long)fullPath._M_dataplus._M_p) >> 2;
      if (uVar7 <= uVar8) {
        pdVar9 = (deUint32 *)0x0;
        if (uVar8 == uVar7) {
          pdVar9 = &pBVar5->index;
        }
        goto LAB_008a6335;
      }
      ndx = (size_t)pBVar5->index;
      if ((ulong)((long)(pLVar4->m_elements).
                        super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pLVar4->m_elements).
                        super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) <= ndx) {
        pIVar6 = (InternalError *)__cxa_allocate_exception(0x38);
        tcu::InternalError::InternalError
                  (pIVar6,(char *)0x0,"(size_t)curNode.index < index->size()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkBinaryRegistry.cpp"
                   ,0xc1);
LAB_008a6423:
        __cxa_throw(pIVar6,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
    }
    pdVar9 = (deUint32 *)0x0;
    if (pBVar5->word == 0) {
LAB_008a6335:
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&fullPath);
      if (pdVar9 == (deUint32 *)0x0) {
        this_01 = (ProgramNotFoundException *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&fullPath,"Program not found in index",(allocator<char> *)&bytes);
        ProgramNotFoundException::ProgramNotFoundException(this_01,id,&fullPath);
        __cxa_throw(this_01,&ProgramNotFoundException::typeinfo,tcu::Exception::~Exception);
      }
      anon_unknown_8::getProgramPath(&fullPath,&this->m_srcPath,*pdVar9);
      iVar2 = (*this->m_archive->_vptr_Archive[2])(this->m_archive,fullPath._M_dataplus._M_p);
      progRes.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.ptr =
           (Resource *)CONCAT44(extraout_var_00,iVar2);
      uVar3 = (*(progRes.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.
                ptr)->_vptr_Resource[3])
                        (progRes.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>
                         .m_data.ptr);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&bytes,(long)(int)uVar3,(allocator_type *)((long)&uStack_a8 + 7));
      if (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        (*(progRes.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.ptr)->
          _vptr_Resource[2])
                  (progRes.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.
                   m_data.ptr,
                   bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,(ulong)uVar3);
        this_00 = (ProgramBinary *)operator_new(0x20);
        ProgramBinary::ProgramBinary
                  (this_00,PROGRAM_FORMAT_SPIRV,
                   (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                   bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::~UniqueBase
                  (&progRes.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>);
        std::__cxx11::string::~string((string *)&fullPath);
        return this_00;
      }
      pIVar6 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (pIVar6,(char *)0x0,"!bytes.empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkBinaryRegistry.cpp"
                 ,0x25b);
      __cxa_throw(pIVar6,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    ndx = ndx + 1;
  } while (ndx < (ulong)((long)(pLVar4->m_elements).
                               super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pLVar4->m_elements).
                               super__Vector_base<vk::BinaryRegistryDetail::BinaryIndexNode,_std::allocator<vk::BinaryRegistryDetail::BinaryIndexNode>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3));
  pIVar6 = (InternalError *)__cxa_allocate_exception(0x38);
  tcu::InternalError::InternalError
            (pIVar6,(char *)0x0,"nodeNdx < index->size()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/framework/vulkan/vkBinaryRegistry.cpp"
             ,0xd0);
  goto LAB_008a6423;
}

Assistant:

ProgramBinary* BinaryRegistryReader::loadProgram (const ProgramIdentifier& id) const
{
	if (!m_binaryIndex)
	{
		try
		{
			m_binaryIndex = BinaryIndexPtr(new BinaryIndexAccess(de::MovePtr<tcu::Resource>(m_archive.getResource(getIndexPath(m_srcPath).c_str()))));
		}
		catch (const tcu::ResourceError& e)
		{
			throw ProgramNotFoundException(id, string("Failed to open binary index (") + e.what() + ")");
		}
	}

	{
		const deUint32*	indexPos	= findBinaryIndex(m_binaryIndex.get(), id);

		if (indexPos)
		{
			const string	fullPath	= getProgramPath(m_srcPath, *indexPos);

			try
			{
				de::UniquePtr<tcu::Resource>	progRes		(m_archive.getResource(fullPath.c_str()));
				const int						progSize	= progRes->getSize();
				vector<deUint8>					bytes		(progSize);

				TCU_CHECK_INTERNAL(!bytes.empty());

				progRes->read(&bytes[0], progSize);

				return new ProgramBinary(vk::PROGRAM_FORMAT_SPIRV, bytes.size(), &bytes[0]);
			}
			catch (const tcu::ResourceError& e)
			{
				throw ProgramNotFoundException(id, e.what());
			}
		}
		else
			throw ProgramNotFoundException(id, "Program not found in index");
	}
}